

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testInvalidQueryName(ErrorsTest *this)

{
  char cVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  undefined4 *puVar8;
  Enum<int,_2UL> EVar9;
  Enum<int,_2UL> local_d28;
  MessageBuilder local_d18;
  GetNameFunc local_b98;
  int local_b90;
  Enum<int,_2UL> local_b88;
  MessageBuilder local_b78;
  GetNameFunc local_9f8;
  int local_9f0;
  Enum<int,_2UL> local_9e8;
  MessageBuilder local_9d8;
  GetNameFunc local_858;
  int local_850;
  Enum<int,_2UL> local_848;
  MessageBuilder local_838;
  GetNameFunc local_6b8;
  int local_6b0;
  Enum<int,_2UL> local_6a8;
  MessageBuilder local_698;
  GetNameFunc local_518;
  int local_510;
  Enum<int,_2UL> local_508;
  MessageBuilder local_4f8;
  GetNameFunc local_378;
  int local_370;
  Enum<int,_2UL> local_368;
  MessageBuilder local_358;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8;
  MessageBuilder local_1b8;
  int local_38;
  GLenum error;
  GLuint local_28;
  GLuint local_24;
  GLuint query;
  GLuint buffer;
  bool is_error;
  bool is_ok;
  long lStack_18;
  GLuint invalid_query;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  buffer = 0;
  query._3_1_ = 1;
  query._2_1_ = 0;
  do {
    buffer = buffer + 1;
    cVar1 = (**(code **)(lStack_18 + 0xca0))();
  } while (cVar1 != '\0');
  local_24 = 0;
  local_28 = 0;
  (**(code **)(lStack_18 + 0x6c8))(1,&local_24);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x23c);
  (**(code **)(lStack_18 + 0x40))(0x8c8e,local_24);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x23f);
  (**(code **)(lStack_18 + 0x150))(0x8c8e,8,0,0x88ea);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x242);
  (*this->m_pGetQueryBufferObjectiv)(buffer,local_24,0x8866,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1b8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [77])
                        "glGetQueryBufferObjectiv called with invalid query name has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_1d8 = EVar9.m_getName;
    local_1d0 = EVar9.m_value;
    local_1c8.m_getName = local_1d8;
    local_1c8.m_value = local_1d0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1c8);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectuiv)(buffer,local_24,0x8866,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_358,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_358,
                        (char (*) [78])
                        "glGetQueryBufferObjectuiv called with invalid query name has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_378 = EVar9.m_getName;
    local_370 = EVar9.m_value;
    local_368.m_getName = local_378;
    local_368.m_value = local_370;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_368);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjecti64v)(buffer,local_24,0x8866,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_4f8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_4f8,
                        (char (*) [79])
                        "glGetQueryBufferObjecti64v called with invalid query name has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_518 = EVar9.m_getName;
    local_510 = EVar9.m_value;
    local_508.m_getName = local_518;
    local_508.m_value = local_510;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_508);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4f8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectui64v)(buffer,local_24,0x8866,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_698,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_698,
                        (char (*) [80])
                        "glGetQueryBufferObjectui64v called with invalid query name has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_6b8 = EVar9.m_getName;
    local_6b0 = EVar9.m_value;
    local_6a8.m_getName = local_6b8;
    local_6a8.m_value = local_6b0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_6a8);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_698);
    query._3_1_ = 0;
  }
  (**(code **)(lStack_18 + 0x3d8))(0x8914,1,&local_28);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glCreateQueries have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x286);
  (**(code **)(lStack_18 + 0x20))(0x8914,local_28);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glCreateQueries have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x289);
  (*this->m_pGetQueryBufferObjectiv)(local_28,local_24,0x8866,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_838,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_838,
                        (char (*) [78])
                        "glGetQueryBufferObjectiv called with active query object has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_858 = EVar9.m_getName;
    local_850 = EVar9.m_value;
    local_848.m_getName = local_858;
    local_848.m_value = local_850;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_848);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_838);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectuiv)(local_28,local_24,0x8866,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_9d8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_9d8,
                        (char (*) [79])
                        "glGetQueryBufferObjectuiv called with active query object has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_9f8 = EVar9.m_getName;
    local_9f0 = EVar9.m_value;
    local_9e8.m_getName = local_9f8;
    local_9e8.m_value = local_9f0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_9e8);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_9d8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjecti64v)(local_28,local_24,0x8866,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_b78,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_b78,
                        (char (*) [80])
                        "glGetQueryBufferObjecti64v called with active query object has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_b98 = EVar9.m_getName;
    local_b90 = EVar9.m_value;
    local_b88.m_getName = local_b98;
    local_b88.m_value = local_b90;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b88);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_b78);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectui64v)(local_28,local_24,0x8866,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_d18,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_d18,
                        (char (*) [81])
                        "glGetQueryBufferObjectui64v called with active query object has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_d28.m_getName = EVar9.m_getName;
    local_d28.m_value = EVar9.m_value;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_d28);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [45])", however GL_INVALID_OPERATION was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_d18);
    query._3_1_ = 0;
  }
  if (local_28 != 0) {
    (**(code **)(lStack_18 + 0x628))(0x8914);
    (**(code **)(lStack_18 + 0x458))(1,&local_28);
  }
  if (local_24 != 0) {
    (**(code **)(lStack_18 + 0x438))(1,&local_24);
  }
  do {
    iVar2 = (**(code **)(lStack_18 + 0x800))();
  } while (iVar2 != 0);
  if ((query._2_1_ & 1) == 0) {
    return (bool)(query._3_1_ & 1);
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::testInvalidQueryName()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Creating invalid query name. */
	glw::GLuint invalid_query = 0;

	/* Default result. */
	bool is_ok	= true;
	bool is_error = false;

	while (gl.isQuery(++invalid_query))
		;

	/* Test's objects. */
	glw::GLuint buffer = 0;
	glw::GLuint query  = 0;

	try
	{
		/* Creating buffer for the test. */
		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers have failed");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(glw::GLint64), DE_NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		/* Test invalid query object name (integer version). */
		m_pGetQueryBufferObjectiv(invalid_query, buffer, GL_QUERY_RESULT, 0);

		glw::GLenum error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectiv called with invalid query name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test invalid query object name (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(invalid_query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectuiv called with invalid query name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test invalid query object name (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(invalid_query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjecti64v called with invalid query name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test invalid query object name (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(invalid_query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectui64v called with invalid query name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Create query object for the test. */
		gl.createQueries(s_targets[0], 1, &query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		gl.beginQuery(s_targets[0], query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		/* Test query of active query object name (integer version). */
		m_pGetQueryBufferObjectiv(query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectiv called with active query object has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of active query object name (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectuiv called with active query object has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of active query object name (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjecti64v called with active query object has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of active query object name (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(query, buffer, GL_QUERY_RESULT, 0);

		error = gl.getError();

		if (GL_INVALID_OPERATION != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectui64v called with active query object has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_OPERATION was expected."
				<< tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_error = true;
	}

	/* Releasing objects. */
	if (query)
	{
		gl.endQuery(s_targets[0]);

		gl.deleteQueries(1, &query);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Error cleanup. */
	while (gl.getError())
		;

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}